

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O1

void __thiscall ExprWriter::writeCastType(ExprWriter *this,Type *Ty)

{
  ostream *poVar1;
  bool bVar2;
  TypeKind TVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar1 = this->ss;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  (*Ty->_vptr_Type[3])(&local_50,Ty);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar2 = PointerType::classof(Ty);
  if ((bVar2) && (Ty[1].isConst == true)) {
    std::__ostream_insert<char,std::char_traits<char>>(this->ss," (",2);
    if (Ty[1].kind != TK_FunctionPointerType) {
      TVar3 = TK_FunctionPointerType;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(this->ss,"*",1);
        TVar3 = TVar3 + TK_StructType;
      } while (TVar3 < Ty[1].kind);
    }
    poVar1 = this->ss;
    std::operator+(&local_50,")",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(Ty + 2));
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->ss,")",1);
  return;
}

Assistant:

void ExprWriter::writeCastType(Type *Ty) {
    ss << "(" << Ty->toString();
    if (auto PT = llvm::dyn_cast_or_null<const PointerType>(Ty)) {
        if (PT->isArrayPointer) {
            ss << " (";
            for (unsigned i = 0; i < PT->levels; i++) {
                ss << "*";
            }
            ss << ")" + PT->sizes;
        }
    }
    ss << ")";
}